

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O0

void wolffstep<trng::mrg3>(mrg3 *R,lattice *s,double T)

{
  bool bVar1;
  result_type_conflict rVar2;
  result_type_conflict rVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  lattice *in_RSI;
  double in_XMM0_Qa;
  int oldspin;
  coord r;
  bernoulli_dist<bool> B;
  uniform_int_dist U;
  double padd;
  queue<coord,_std::deque<coord,_std::allocator<coord>_>_> buffer;
  result_type_conflict in_stack_fffffffffffffee8;
  result_type_conflict in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  value_type in_stack_ffffffffffffff00;
  value_type local_ac;
  undefined1 local_a2;
  undefined1 local_a1;
  double local_70;
  double local_18;
  lattice *local_10;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  std::queue<coord,std::deque<coord,std::allocator<coord>>>::
  queue<std::deque<coord,std::allocator<coord>>,void>
            ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,
                               CONCAT15(in_stack_fffffffffffffef5,
                                        CONCAT14(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                )))));
  local_70 = exp(-2.0 / local_18);
  local_70 = 1.0 - local_70;
  lattice::size(local_10);
  trng::uniform_int_dist::uniform_int_dist
            ((uniform_int_dist *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,
                               CONCAT15(in_stack_fffffffffffffef5,
                                        CONCAT14(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                )))),in_stack_fffffffffffffeec,
             in_stack_fffffffffffffee8);
  local_a1 = 1;
  local_a2 = 0;
  trng::bernoulli_dist<bool>::bernoulli_dist
            ((bernoulli_dist<bool> *)in_stack_ffffffffffffff00,
             (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (bool *)CONCAT17(in_stack_fffffffffffffef7,
                              CONCAT16(in_stack_fffffffffffffef6,
                                       CONCAT15(in_stack_fffffffffffffef5,
                                                CONCAT14(in_stack_fffffffffffffef4,
                                                         in_stack_fffffffffffffef0)))),
             (bool *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  coord::coord(&local_ac);
  rVar2 = trng::uniform_int_dist::operator()
                    ((uniform_int_dist *)in_stack_ffffffffffffff00,
                     (mrg3 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_ac.x = rVar2;
  rVar3 = trng::uniform_int_dist::operator()
                    ((uniform_int_dist *)in_stack_ffffffffffffff00,
                     (mrg3 *)CONCAT44(rVar2,in_stack_fffffffffffffef8));
  local_ac.y = rVar3;
  iVar4 = lattice::get((lattice *)CONCAT44(rVar2,rVar3),in_stack_ffffffffffffff00);
  lattice::flipp((lattice *)CONCAT44(rVar2,rVar3),in_stack_ffffffffffffff00);
  std::queue<coord,_std::deque<coord,_std::allocator<coord>_>_>::push
            ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,
                               CONCAT15(in_stack_fffffffffffffef5,
                                        CONCAT14(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                )))),
             (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  while (bVar1 = std::queue<coord,_std::deque<coord,_std::allocator<coord>_>_>::empty
                           ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)0x11ad57),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar6 = std::queue<coord,_std::deque<coord,_std::allocator<coord>_>_>::front
                       ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)0x11ad6f);
    local_ac = *pvVar6;
    std::queue<coord,_std::deque<coord,_std::allocator<coord>_>_>::pop
              ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)0x11ad84);
    local_ac.x = local_ac.x + -1;
    iVar5 = lattice::get((lattice *)CONCAT44(rVar2,rVar3),in_stack_ffffffffffffff00);
    if ((iVar5 == iVar4) &&
       (in_stack_fffffffffffffef7 =
             trng::bernoulli_dist<bool>::operator()
                       ((bernoulli_dist<bool> *)in_stack_ffffffffffffff00,
                        (mrg3 *)CONCAT44(rVar2,rVar3)), (bool)in_stack_fffffffffffffef7)) {
      std::queue<coord,_std::deque<coord,_std::allocator<coord>_>_>::push
                ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)
                 CONCAT17(in_stack_fffffffffffffef7,
                          CONCAT16(in_stack_fffffffffffffef6,
                                   CONCAT15(in_stack_fffffffffffffef5,
                                            CONCAT14(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0)))),
                 (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      lattice::flipp((lattice *)CONCAT44(rVar2,rVar3),in_stack_ffffffffffffff00);
    }
    local_ac.x = local_ac.x + 2;
    iVar5 = lattice::get((lattice *)CONCAT44(rVar2,rVar3),in_stack_ffffffffffffff00);
    if ((iVar5 == iVar4) &&
       (in_stack_fffffffffffffef6 =
             trng::bernoulli_dist<bool>::operator()
                       ((bernoulli_dist<bool> *)in_stack_ffffffffffffff00,
                        (mrg3 *)CONCAT44(rVar2,rVar3)), (bool)in_stack_fffffffffffffef6)) {
      std::queue<coord,_std::deque<coord,_std::allocator<coord>_>_>::push
                ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)
                 CONCAT17(in_stack_fffffffffffffef7,
                          CONCAT16(in_stack_fffffffffffffef6,
                                   CONCAT15(in_stack_fffffffffffffef5,
                                            CONCAT14(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0)))),
                 (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      lattice::flipp((lattice *)CONCAT44(rVar2,rVar3),in_stack_ffffffffffffff00);
    }
    local_ac.y = local_ac.y + -1;
    local_ac.x = local_ac.x + -1;
    iVar5 = lattice::get((lattice *)CONCAT44(rVar2,rVar3),in_stack_ffffffffffffff00);
    if ((iVar5 == iVar4) &&
       (in_stack_fffffffffffffef5 =
             trng::bernoulli_dist<bool>::operator()
                       ((bernoulli_dist<bool> *)in_stack_ffffffffffffff00,
                        (mrg3 *)CONCAT44(rVar2,rVar3)), (bool)in_stack_fffffffffffffef5)) {
      std::queue<coord,_std::deque<coord,_std::allocator<coord>_>_>::push
                ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)
                 CONCAT17(in_stack_fffffffffffffef7,
                          CONCAT16(in_stack_fffffffffffffef6,
                                   CONCAT15(in_stack_fffffffffffffef5,
                                            CONCAT14(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0)))),
                 (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      lattice::flipp((lattice *)CONCAT44(rVar2,rVar3),in_stack_ffffffffffffff00);
    }
    local_ac.y = local_ac.y + 2;
    iVar5 = lattice::get((lattice *)CONCAT44(rVar2,rVar3),in_stack_ffffffffffffff00);
    if ((iVar5 == iVar4) &&
       (in_stack_fffffffffffffef4 =
             trng::bernoulli_dist<bool>::operator()
                       ((bernoulli_dist<bool> *)in_stack_ffffffffffffff00,
                        (mrg3 *)CONCAT44(rVar2,rVar3)), (bool)in_stack_fffffffffffffef4)) {
      std::queue<coord,_std::deque<coord,_std::allocator<coord>_>_>::push
                ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)
                 CONCAT17(in_stack_fffffffffffffef7,
                          CONCAT16(in_stack_fffffffffffffef6,
                                   CONCAT15(in_stack_fffffffffffffef5,
                                            CONCAT14(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0)))),
                 (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      in_stack_ffffffffffffff00 = local_ac;
      lattice::flipp((lattice *)CONCAT44(rVar2,rVar3),local_ac);
    }
    local_ac.y = local_ac.y + -1;
  }
  std::queue<coord,_std::deque<coord,_std::allocator<coord>_>_>::~queue
            ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)0x11afee);
  return;
}

Assistant:

void wolffstep(RNG_type &R, lattice &s, double T) {
  std::queue<coord> buffer;
  const double padd = 1.0 - std::exp(-2.0 / T);

  trng::uniform_int_dist U(0, s.size());
  trng::bernoulli_dist<bool> B(padd, true, false);
  coord r;

  r.x = U(R);
  r.y = U(R);
  const int oldspin{s.get(r)};
  s.flipp(r);
  buffer.push(r);
  while (!buffer.empty()) {
    r = buffer.front();
    buffer.pop();
    --r.x;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    ++r.x;
    ++r.x;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    --r.x;
    --r.y;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    ++r.y;
    ++r.y;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    --r.y;
  }
}